

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_logisim.cpp
# Opt level: O2

wire_node_t * __thiscall
anon_unknown.dwarf_1bdfec::LogisimParser::point_on_wire(LogisimParser *this,Position position)

{
  wire_node_t *pwVar1;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *node;
  wire_node_t *pwVar3;
  Position local_20;
  
  pwVar3 = (this->m_context).m_wires.
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pwVar1 = (this->m_context).m_wires.
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_20 = position;
  while( true ) {
    if (pwVar3 == pwVar1) {
      return (wire_node_t *)0x0;
    }
    _Var2 = std::
            __find_if<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_long_const>>
                      ((pwVar3->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                       _M_impl.super__Vector_impl_data._M_start,
                       (pwVar3->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                       _M_impl.super__Vector_impl_data._M_finish,&local_20);
    if (_Var2._M_current !=
        (pwVar3->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_finish) break;
    pwVar3 = pwVar3 + 1;
  }
  return pwVar3;
}

Assistant:

LogisimParser::wire_node_t *LogisimParser::point_on_wire(Position position) {

    for (auto &node : m_context.m_wires) {
        auto res = std::find(std::begin(node), std::end(node), position.m_full);
        if (res != std::end(node)) {
            return &node;
        }
    }

    return nullptr;
}